

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O1

pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> __thiscall
embree::VerifyScene::addSphereHair
          (VerifyScene *this,RandomSampler *sampler,RTCBuildQuality quality,Vec3fa *center,
          float radius,avector<Vec3fa> *motion_vector)

{
  uint uVar1;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *extraout_RDX_01;
  Ref<embree::SceneGraph::Node> RVar2;
  avector<Vec3fa> *in_R9;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> pVar3;
  Ref<embree::SceneGraph::Node> node;
  __atomic_base<unsigned_long> local_38;
  Ref<embree::SceneGraph::Node> local_30;
  Ref<embree::SceneGraph::MaterialNode> local_28;
  
  local_28.ptr = (MaterialNode *)0x0;
  SceneGraph::createSphereShapedHair
            ((SceneGraph *)&local_38,(Vec3fa *)motion_vector,radius,&local_28);
  if (local_28.ptr != (MaterialNode *)0x0) {
    (*((local_28.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (in_R9->size_active != 0) {
    local_30.ptr = (Node *)local_38._M_i;
    if ((long *)local_38._M_i != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_i + 0x10))();
    }
    SceneGraph::set_motion_vector(&local_30,in_R9);
    if (local_30.ptr != (Node *)0x0) {
      (*((local_30.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  uVar1 = addGeometry((VerifyScene *)sampler,(RTCBuildQuality)center,
                      (Ref<embree::SceneGraph::Node> *)&local_38);
  *(uint *)&(this->super_RefCount)._vptr_RefCount = uVar1;
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = local_38._M_i;
  RVar2.ptr = extraout_RDX;
  if ((long *)local_38._M_i != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_i + 0x10))();
    RVar2.ptr = extraout_RDX_00;
  }
  if ((long *)local_38._M_i != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_i + 0x18))();
    RVar2.ptr = extraout_RDX_01;
  }
  pVar3.second.ptr = RVar2.ptr;
  pVar3._0_8_ = this;
  return pVar3;
}

Assistant:

std::pair<unsigned,Ref<SceneGraph::Node>> addSphereHair (RandomSampler& sampler, RTCBuildQuality quality, const Vec3fa& center, const float radius, const avector<Vec3fa>& motion_vector = avector<Vec3fa>())
    {
      Ref<SceneGraph::Node> node = SceneGraph::createSphereShapedHair(center,radius);
      if (motion_vector.size()) SceneGraph::set_motion_vector(node,motion_vector);
      return addGeometry2(quality,node);
    }